

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_innerproduct_dropout(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar7 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    ppvVar1 = &(this->super_ModelWriter).layers;
    uVar8 = lVar7 >> 3;
    lVar7 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar7]->type);
      if (iVar5 == 0) {
        uVar9 = lVar7 + 1;
        if (uVar9 < uVar8) {
          iVar5 = *(((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar7]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar6 = std::__cxx11::string::compare
                              ((char *)&((*ppvVar1)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
            if (((iVar6 == 0) &&
                (pLVar3 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar9],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 4)) && (*piVar4 == iVar5))
            goto LAB_00165dbe;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar8);
        }
        else {
LAB_00165dbe:
          if (uVar9 != uVar8) {
            fuse_innerproduct_dropout();
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != uVar8 + (uVar8 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_innerproduct_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Dropout
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Dropout")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Dropout to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[j];

        fprintf(stderr, "fuse_innerproduct_dropout %s %s\n", innerproduct->name.c_str(), dropout->name.c_str());

        float scale = dropout->scale;
        if (scale != 1.f)
        {
            const int num_output = innerproduct->num_output;
            const int weight_per_outch = innerproduct->weight_data_size / num_output;

            float* weight = innerproduct->weight_data;
            for (int i = 0; i < num_output; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= scale;
                }
            }

            if (innerproduct->bias_term)
            {
                float* bias = innerproduct->bias_data;
                for (int i = 0; i < num_output; i++)
                {
                    bias[i] *= scale;
                }
            }
        }

        int top_blob_index_final = dropout->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        dropout->type = "ncnnfused";
    }

    return 0;
}